

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskscheduler.cpp
# Opt level: O0

void __thiscall TaskScheduler::start(TaskScheduler *this)

{
  size_type sVar1;
  vector<std::thread,_std::allocator<std::thread>_> *in_RDI;
  int i_1;
  int i;
  type work;
  mutex ex2;
  mutex ex;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  int n;
  int finished;
  int total;
  value_type *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  int iVar2;
  undefined4 in_stack_ffffffffffffff3c;
  ConsoleLogger *in_stack_ffffffffffffff40;
  int local_ac;
  type *__f;
  vector<std::thread,_std::allocator<std::thread>_> *this_00;
  type local_58;
  vector<std::thread,_std::allocator<std::thread>_> local_30;
  int local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  sVar1 = std::
          queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
          ::size((queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                  *)0x18e331);
  local_c = (undefined4)sVar1;
  local_10 = 0;
  local_14 = std::thread::hardware_concurrency();
  github111116::ConsoleLogger::info<char[25],int,char[8]>
            (in_stack_ffffffffffffff40,
             (char (*) [25])CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (int *)in_RDI,(char (*) [8])in_stack_ffffffffffffff28);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x18e37e);
  std::mutex::mutex((mutex *)0x18e38b);
  std::mutex::mutex((mutex *)0x18e395);
  __f = &local_58;
  this_00 = in_RDI;
  for (local_ac = 0; local_ac < local_14; local_ac = local_ac + 1) {
    std::thread::thread<TaskScheduler::start()::__0&,,void>((thread *)this_00,__f);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              (in_RDI,in_stack_ffffffffffffff28);
    std::thread::~thread((thread *)0x18e414);
  }
  for (iVar2 = 0; iVar2 < local_14; iVar2 = iVar2 + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_30,(long)iVar2);
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffff40);
  return;
}

Assistant:

void TaskScheduler::start()
{
	int total = tasks.size();
	int finished = 0;
#ifndef SINGLE_THREADED
	int n = std::thread::hardware_concurrency();
	console.info("Scheduler: Starting with", n, "threads");
	std::vector<std::thread> threads;
	std::mutex ex,ex2;
	auto work = [&](){
		try {
			while (1) {
				task_t task = NULL;
				ex.lock();
				if (!tasks.empty()) {
					task = tasks.front();
					tasks.pop();
				}
				ex.unlock();
				if (task == NULL) break;
				task();
				if (onprogress) {
					ex2.lock();
					finished += 1;
					onprogress(finished, total);
					ex2.unlock();
				}
			}
		}
		catch (const char* err) {
			console.error(err);
			throw err;
		}
	};
	for (int i=0; i<n; ++i)
		threads.push_back(std::thread(work));
	for (int i=0; i<n; ++i)
		threads[i].join();
#else
	console.warn("Scheduler: Starting single threaded");
	while (!tasks.empty()) {
		task_t task = tasks.front();
		tasks.pop();
		task();
		if (onprogress) {
			finished += 1;
			onprogress(finished, total);
		}
	}
#endif
}